

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void ad_print(AD *ad,char *block_type)

{
  Integer IVar1;
  undefined8 in_RSI;
  TableData in_RDI;
  Integer memhandle;
  
  IVar1 = ma_table_lookup_assoc(in_RDI);
  printf("%s block \'%s\', handle ",in_RSI,in_RDI + 0x10);
  if (IVar1 == -1) {
    printf("unknown");
  }
  else {
    printf("%ld",IVar1);
  }
  printf(", address 0x%lx",in_RDI);
  return;
}

Assistant:

private void ad_print(ad, block_type)
    AD        *ad;        /* to print */
    char    *block_type;    /* for output */
{
    Integer    memhandle;    /* memhandle for AD */

    /* convert AD to memhandle */
    memhandle = ma_table_lookup_assoc((TableData)ad);

    /* print to stdout */
    (void)printf("%s block '%s', handle ",
        block_type,
        ad->name);
    if (memhandle == TABLE_HANDLE_NONE)
        (void)printf("unknown");
    else
        (void)printf("%ld",
            (size_t)memhandle);
    (void)printf(", address 0x%lx",
        (size_t)ad);
}